

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.cpp
# Opt level: O1

UBool __thiscall icu_63::UVector32::removeAll(UVector32 *this,UVector32 *other)

{
  int iVar1;
  int32_t *piVar2;
  int32_t *piVar3;
  UBool UVar4;
  int32_t *piVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  int32_t iVar10;
  
  if (other->count < 1) {
    return '\0';
  }
  piVar2 = other->elements;
  piVar3 = this->elements;
  lVar7 = 0;
  UVar4 = '\0';
  do {
    iVar1 = this->count;
    uVar9 = 0xffffffff;
    if (0 < (long)iVar1) {
      uVar6 = 0;
      do {
        if (piVar3[uVar6] == piVar2[lVar7]) {
          uVar9 = uVar6 & 0xffffffff;
          break;
        }
        uVar6 = uVar6 + 1;
      } while ((long)iVar1 != uVar6);
    }
    if (-1 < (int)uVar9) {
      iVar10 = iVar1 + -1;
      if ((int)uVar9 < iVar10) {
        piVar5 = piVar3 + uVar9 + 1;
        do {
          piVar5[-1] = *piVar5;
          iVar10 = this->count + -1;
          piVar5 = piVar5 + 1;
          uVar8 = (int)uVar9 + 1;
          uVar9 = (ulong)uVar8;
        } while ((int)uVar8 < iVar10);
      }
      this->count = iVar10;
      UVar4 = '\x01';
    }
    lVar7 = lVar7 + 1;
    if (other->count <= lVar7) {
      return UVar4;
    }
  } while( true );
}

Assistant:

UBool UVector32::removeAll(const UVector32& other) {
    UBool changed = FALSE;
    for (int32_t i=0; i<other.size(); ++i) {
        int32_t j = indexOf(other.elements[i]);
        if (j >= 0) {
            removeElementAt(j);
            changed = TRUE;
        }
    }
    return changed;
}